

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::RecordSet::RecordSet(RecordSet *this,KDataStream *stream)

{
  KDataStream *stream_local;
  RecordSet *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RecordSet_00332698;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_vui8RecVals);
  (*(this->super_DataTypeBase)._vptr_DataTypeBase[3])(this,stream);
  return;
}

Assistant:

RecordSet::RecordSet(KDataStream &stream) noexcept(false)
{
    Decode( stream );
}